

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool ParseString(TidyDocImpl *doc,TidyOptionImpl *option)

{
  StreamIn *pSVar1;
  tchar tVar2;
  Bool BVar3;
  ulong uVar4;
  tchar tVar5;
  bool bVar6;
  bool bVar7;
  tmbchar buf [8192];
  tmbchar local_2038 [8200];
  
  tVar2 = SkipWhite(&doc->config);
  if ((tVar2 == 0x27) || (tVar5 = 0, tVar2 == 0x22)) {
    tVar5 = tVar2;
    if ((doc->config).c == 0xffffffff) {
      tVar2 = 0xffffffff;
    }
    else {
      pSVar1 = (doc->config).cfgIn;
      if (pSVar1 == (StreamIn *)0x0) {
        tVar2 = 0xffffffff;
      }
      else {
        tVar2 = prvTidyReadChar(pSVar1);
      }
      (doc->config).c = tVar2;
    }
  }
  bVar7 = true;
  uVar4 = 0;
  bVar6 = false;
  do {
    while( true ) {
      if (((tVar2 + 1 < 0xf) && ((0x4801U >> (tVar2 + 1 & 0x1f) & 1) != 0)) ||
         ((tVar5 != 0 && (tVar2 == tVar5)))) goto LAB_00134f29;
      BVar3 = prvTidyIsWhite(tVar2);
      if (BVar3 != no) break;
LAB_00134ec7:
      local_2038[uVar4] = (tmbchar)tVar2;
      if ((doc->config).c == 0xffffffff) {
        tVar2 = 0xffffffff;
      }
      else {
        pSVar1 = (doc->config).cfgIn;
        if (pSVar1 == (StreamIn *)0x0) {
          tVar2 = 0xffffffff;
        }
        else {
          tVar2 = prvTidyReadChar(pSVar1);
        }
        (doc->config).c = tVar2;
      }
      bVar7 = uVar4 < 0x1ffd;
      uVar4 = uVar4 + 1;
      bVar6 = true;
      if (uVar4 == 0x1ffe) {
        uVar4 = 0x1ffe;
        goto LAB_00134f2c;
      }
    }
    if (bVar6) {
      tVar2 = 0x20;
      goto LAB_00134ec7;
    }
    if ((doc->config).c == 0xffffffff) {
      tVar2 = 0xffffffff;
    }
    else {
      pSVar1 = (doc->config).cfgIn;
      if (pSVar1 == (StreamIn *)0x0) {
        tVar2 = 0xffffffff;
      }
      else {
        tVar2 = prvTidyReadChar(pSVar1);
      }
      (doc->config).c = tVar2;
    }
    bVar6 = false;
  } while (bVar7);
LAB_00134f29:
  uVar4 = uVar4 & 0xffffffff;
LAB_00134f2c:
  local_2038[uVar4] = '\0';
  SetOptionValue(doc,option->id,local_2038);
  return yes;
}

Assistant:

Bool ParseString( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[8192];
    uint i = 0;
    tchar delim = 0;
    Bool waswhite = yes;

    tchar c = SkipWhite( cfg );

    if ( c == '"' || c == '\'' )
    {
        delim = c;
        c = AdvanceChar( cfg );
    }

    while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
    {
        if ( delim && c == delim )
            break;

        if ( TY_(IsWhite)(c) )
        {
            if ( waswhite )
            {
                c = AdvanceChar( cfg );
                continue;
            }
            c = ' ';
        }
        else
            waswhite = no;

        buf[i++] = (tmbchar) c;
        c = AdvanceChar( cfg );
    }
    buf[i] = '\0';

    SetOptionValue( doc, option->id, buf );
    return yes;
}